

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,big_decimal_fp *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  bool bVar1;
  type tVar2;
  int *piVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *pbVar4;
  int local_198;
  int local_194;
  char local_18d;
  int local_18c;
  anon_class_48_6_9afe1116 local_188;
  float_specs local_158;
  int local_14c;
  undefined1 auStack_148 [4];
  int num_zeros;
  char **local_140;
  int *local_138;
  int *local_130;
  char *local_128;
  int *local_120;
  float_specs local_118;
  int local_10c;
  undefined1 auStack_108 [4];
  int num_zeros_3;
  char **local_100;
  int *local_f8;
  basic_format_specs<char> *local_f0;
  float_specs *local_e8;
  char *local_e0;
  int *local_d8;
  float_specs local_d0;
  int local_c8;
  int local_c4;
  int num_zeros_2;
  int exp;
  buffer<char> *local_b8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_b0;
  float_specs local_a8;
  undefined1 local_a0 [8];
  anon_class_40_7_ef14d3db write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int local_64;
  undefined1 auStack_60 [4];
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  size_t size;
  sign_t sign;
  int significand_size;
  char *significand;
  basic_format_specs<char> *pbStack_30;
  char decimal_point_local;
  basic_format_specs<char> *specs_local;
  big_decimal_fp *fp_local;
  float_specs fspecs_local;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_local;
  
  _sign = fp->significand;
  significand._7_1_ = decimal_point;
  pbStack_30 = specs;
  specs_local = (basic_format_specs<char> *)fp;
  fp_local = (big_decimal_fp *)fspecs;
  fspecs_local = (float_specs)out.container;
  size._4_4_ = get_significand_size(fp);
  size._0_4_ = fp_local._4_4_ >> 8 & 0xff;
  tVar2 = to_unsigned<int>(size._4_4_);
  register0x00000000 = (size_t)(tVar2 + ((sign_t)size != none));
  use_exp_format.fspecs.precision = *(int *)((specs_local->fill).data_ + 2) + size._4_4_ + -1;
  _auStack_60 = (float_specs)fp_local;
  use_exp_format.fspecs._4_4_ = use_exp_format.fspecs.precision;
  bVar1 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
          ::anon_class_12_2_f0c9b3c6::operator()((anon_class_12_2_f0c9b3c6 *)auStack_60);
  if (bVar1) {
    local_64 = 0;
    if ((fp_local._4_4_ >> 0x14 & 1) == 0) {
      if (size._4_4_ == 1) {
        significand._7_1_ = '\0';
      }
    }
    else {
      abs_output_exp = (int)fp_local - size._4_4_;
      exp_digits = 0;
      piVar3 = std::max<int>(&abs_output_exp,&exp_digits);
      local_64 = *piVar3;
      tVar2 = to_unsigned<int>(local_64);
      register0x00000000 = tVar2 + stack0xffffffffffffffb0;
    }
    if ((int)use_exp_format.fspecs._4_4_ < 0) {
      local_18c = -use_exp_format.fspecs._4_4_;
    }
    else {
      local_18c = use_exp_format.fspecs._4_4_;
    }
    write._36_4_ = 2;
    if ((99 < local_18c) && (write._36_4_ = 3, 999 < local_18c)) {
      write._36_4_ = 4;
    }
    tVar2 = to_unsigned<int>((significand._7_1_ != '\0') + 2 + write._36_4_);
    register0x00000000 = tVar2 + stack0xffffffffffffffb0;
    local_18d = 'E';
    if (((ulong)fp_local & 0x1000000000000) == 0) {
      local_18d = 'e';
    }
    write.output_exp._3_1_ = local_18d;
    local_a0._0_4_ = (sign_t)size;
    write._0_8_ = _sign;
    write.significand._0_4_ = size._4_4_;
    write.significand._4_1_ = significand._7_1_;
    write.significand_size = local_64;
    write.decimal_point = local_18d;
    write.num_zeros = use_exp_format.fspecs._4_4_;
    if (pbStack_30->width < 1) {
      local_b0.container = (buffer<char> *)fspecs_local;
      pbVar4 = reserve<std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                         ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&fspecs_local,
                          register0x00000000);
      _num_zeros_2 = pbVar4->container;
      local_b8 = (buffer<char> *)
                 write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
                 ::anon_class_40_7_ef14d3db::operator()
                           ((anon_class_40_7_ef14d3db *)local_a0,_num_zeros_2);
      out_local = base_iterator<std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                            (local_b0,(back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_b8
                            );
    }
    else {
      local_a8 = fspecs_local;
      out_local = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                            ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)fspecs_local,
                             pbStack_30,register0x00000000,(anon_class_40_7_ef14d3db *)local_a0);
    }
  }
  else {
    local_c4 = *(int *)((specs_local->fill).data_ + 2) + size._4_4_;
    if (*(int *)((specs_local->fill).data_ + 2) < 0) {
      if (local_c4 < 1) {
        local_14c = -local_c4;
        if (((size._4_4_ == 0) && (-1 < (int)fp_local)) && ((int)fp_local < local_14c)) {
          local_14c = (int)fp_local;
        }
        tVar2 = to_unsigned<int>(local_14c);
        register0x00000000 = (tVar2 + 2) + stack0xffffffffffffffb0;
        local_158 = fspecs_local;
        local_188.sign = (sign_t *)&size;
        local_188.num_zeros = &local_14c;
        local_188.significand_size = (int *)((long)&size + 4);
        local_188.fspecs = (float_specs *)&fp_local;
        local_188.decimal_point = (char *)((long)&significand + 7);
        local_188.significand = (char **)&sign;
        out_local = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_4_>
                              ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)fspecs_local,
                               pbStack_30,register0x00000000,&local_188);
      }
      else {
        if ((fp_local._4_4_ >> 0x14 & 1) == 0) {
          local_194 = 0;
        }
        else {
          local_194 = (int)fp_local - size._4_4_;
        }
        local_10c = local_194;
        if (local_194 < 1) {
          local_198 = 0;
        }
        else {
          local_198 = local_194;
        }
        tVar2 = to_unsigned<int>(local_198);
        register0x00000000 = (tVar2 + 1) + stack0xffffffffffffffb0;
        local_118 = fspecs_local;
        _auStack_148 = (sign_t *)&size;
        local_140 = (char **)&sign;
        local_138 = (int *)((long)&size + 4);
        local_130 = &local_c4;
        local_128 = (char *)((long)&significand + 7);
        local_120 = &local_10c;
        out_local = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_3_>
                              ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)fspecs_local,
                               pbStack_30,register0x00000000,(anon_class_48_6_48d028d1 *)auStack_148
                              );
      }
    }
    else {
      tVar2 = to_unsigned<int>(*(int *)((specs_local->fill).data_ + 2));
      register0x00000000 = tVar2 + stack0xffffffffffffffb0;
      local_c8 = (int)fp_local - local_c4;
      if ((fp_local._4_4_ >> 0x14 & 1) != 0) {
        if ((local_c8 < 1) && ((char)((ulong)fp_local >> 0x20) != '\x02')) {
          local_c8 = 1;
        }
        if (0 < local_c8) {
          tVar2 = to_unsigned<int>(local_c8);
          register0x00000000 = tVar2 + stack0xffffffffffffffb0;
        }
      }
      local_d0 = fspecs_local;
      _auStack_108 = (sign_t *)&size;
      local_100 = (char **)&sign;
      local_f8 = (int *)((long)&size + 4);
      local_f0 = specs_local;
      local_e8 = (float_specs *)&fp_local;
      local_e0 = (char *)((long)&significand + 7);
      local_d8 = &local_c8;
      out_local = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_2_>
                            ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)fspecs_local,
                             pbStack_30,stack0xffffffffffffffb0,
                             (anon_class_56_7_a2a26a24 *)auStack_108);
    }
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_local.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}